

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O3

void __thiscall bandit::reporter::info::it_failed(info *this,string *desc,assertion_exception *ex)

{
  int *piVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  failure_formatter_t *pfVar4;
  context_info *pcVar5;
  ostream *poVar6;
  _List_node_base *p_Var7;
  _Elt_pointer pcVar8;
  stringstream ss;
  string local_210;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_failed_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::stringstream::stringstream(local_1b0);
  progress_base::current_context_name_abi_cxx11_(&local_210,(progress_base *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(desc->_M_dataplus)._M_p,desc->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  poVar6 = (ostream *)std::ostream::flush();
  pfVar4 = (this->super_colored_base).super_progress_base.failure_formatter_;
  (*pfVar4->_vptr_interface[2])(&local_1f0,pfVar4,ex);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f0,local_1e8);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  paVar3 = &local_210.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar3) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  p_Var7 = (_List_node_base *)operator_new(0x30);
  p_Var7[1]._M_next = p_Var7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p == paVar3) {
    p_Var7[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,local_210.field_2._M_local_buf[0]);
    p_Var7[2]._M_prev = (_List_node_base *)local_210.field_2._8_8_;
  }
  else {
    p_Var7[1]._M_next = (_List_node_base *)local_210._M_dataplus._M_p;
    p_Var7[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,local_210.field_2._M_local_buf[0]);
  }
  p_Var7[1]._M_prev = (_List_node_base *)local_210._M_string_length;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)paVar3;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar2 = &(this->super_colored_base).super_progress_base.failures_.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar3) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  pcVar8 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar8 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar5 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
    piVar1 = &pcVar5[9].total;
    *piVar1 = *piVar1 + 1;
    pcVar8 = pcVar5 + 10;
  }
  else {
    pcVar8[-1].total = pcVar8[-1].total + 1;
  }
  pcVar8[-1].failed = pcVar8[-1].failed + 1;
  this->indentation_ = this->indentation_ + -1;
  poVar6 = (this->super_colored_base).stm_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\r",1);
  local_210._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&local_210,(char)this->indentation_ * '\x02');
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_210._M_dataplus._M_p,local_210._M_string_length);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_1f0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f0,local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ FAIL ]",8);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_1d0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," it ",4);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(desc->_M_dataplus)._M_p,desc->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar3) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        ++specs_failed_;

        std::stringstream ss;
        ss << current_context_name() << " " << desc << ":" << std::endl
           << failure_formatter_.format(ex);
        failures_.push_back(ss.str());

        ++context_stack_.top().total;
        ++context_stack_.top().failed;
        --indentation_;
        stm_
            << "\r" << indent()
            << colorizer_.bad()
            << "[ FAIL ]"
            << colorizer_.reset()
            << " it " << desc
            << std::endl;
        stm_.flush();
      }